

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O3

ByteSequence * cobs::cobs_encode(ByteSequence *__return_storage_ptr__,ByteSequence *input)

{
  pointer *ppuVar1;
  iterator iVar2;
  ulong in_RAX;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  uchar uVar4;
  long lVar5;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var6;
  uchar *puVar7;
  pointer puVar8;
  uchar *puVar9;
  uchar *puVar10;
  long lVar11;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar10 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar7 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar9 = puVar10;
  uStack_38 = in_RAX;
  if (puVar10 != puVar7) {
    do {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                        (puVar10,puVar7,(long)&uStack_38 + 7);
      lVar11 = (long)_Var3._M_current - (long)puVar10;
      lVar5 = 0xfe;
      if (lVar11 < 0xfe) {
        lVar5 = lVar11;
      }
      _Var6._M_current = puVar10 + 0xfe;
      if (lVar11 < 0xfe) {
        _Var6 = _Var3;
      }
      uVar4 = (char)lVar5 + '\x01';
      uStack_38._0_7_ = CONCAT16(uVar4,(undefined6)uStack_38);
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (__return_storage_ptr__,iVar2,(uchar *)((long)&uStack_38 + 6));
        puVar8 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *iVar2._M_current = uVar4;
        puVar8 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = puVar8;
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 puVar8,puVar10,_Var6._M_current);
      puVar7 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar10 = _Var6._M_current + (_Var6._M_current != puVar7 && lVar11 < 0xfe);
      puVar9 = puVar7;
    } while (puVar10 != puVar7);
  }
  if (puVar9[-1] == '\0') {
    uStack_38._0_6_ = CONCAT15(1,(undefined5)uStack_38);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,(uchar *)((long)&uStack_38 + 5));
    }
    else {
      *iVar2._M_current = '\x01';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteSequence cobs_encode(const ByteSequence &input)
{
  ByteSequence output;
  auto next_zero_byte = input.begin();
  auto previous_zero_byte = input.begin();

  while(next_zero_byte != input.end() )
  {

    next_zero_byte = std::find(next_zero_byte,
                               input.end(),
                               uint8_t(0));

    auto dist = std::distance(previous_zero_byte,next_zero_byte);

	// clip to  max distance
    dist = dist < 254 ? dist: 254;

    if(dist == 254)	next_zero_byte = previous_zero_byte + 254; 

    output.push_back(dist+1);  // add code byte to output

    output.insert(output.end(), previous_zero_byte, next_zero_byte);  //insert block of bytes between to code bytes , e.g two zeros

    if(   dist != 254
          && next_zero_byte != input.end() )
    {
      std:: advance(next_zero_byte,1);//next_zero_byte++;   // if we found a zero we move iterator to prepare for next std::find
    }

    previous_zero_byte = next_zero_byte;
  }

  if(input[input.size()-1] == uint8_t(0)) output.push_back(uint8_t(1)); // last element is zero , add 1 to output


  return(output);
}